

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chests.c
# Opt level: O0

BOOL is_quest_item(uint8_t item)

{
  BOOL local_c;
  uint8_t item_local;
  
  if (((item == '\n') || (item == '\r')) || (item == '\x0f' || item == '\x10')) {
    local_c = TRUE;
  }
  else {
    local_c = FALSE;
  }
  return local_c;
}

Assistant:

BOOL is_quest_item(uint8_t item)
{
    switch(item) {
        case TOKEN:
        case STONES:
        case HARP:
        case STAFF:
            return TRUE;
        default:
            return FALSE;
    }
}